

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

bool __thiscall
QMainWindowLayoutState::restoreState
          (QMainWindowLayoutState *this,QDataStream *_stream,QMainWindowLayoutState *oldState)

{
  QDockAreaLayout *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  QMainWindowLayout *this_01;
  QDockWidgetGroupWindow *this_02;
  QLayout *pQVar4;
  QDockAreaLayoutInfo *this_03;
  QWidget *pQVar5;
  QArrayDataPointer<QDockWidget_*> *this_04;
  QLayoutItem *this_05;
  int i;
  QWidget **ppQVar6;
  long in_FS_OFFSET;
  QRect rect;
  QArrayDataPointer<int> local_148;
  QArrayDataPointer<QDockWidget_*> local_128;
  uchar marker;
  QArrayDataPointer<char> local_108;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  QWidget **local_d8;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108.size = 0;
  local_108.d = (Data *)0x0;
  local_108.ptr = (char *)0x0;
  while (cVar1 = QDataStream::atEnd(), cVar1 == '\0') {
    local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    uStack_e0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)local_e8,0x400,'\0');
    pcVar3 = QByteArray::data((QByteArray *)local_e8);
    QDataStream::readRawData((char *)_stream,(longlong)pcVar3);
    QByteArray::resize((longlong)local_e8);
    QByteArray::append((QByteArray *)&local_108);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_e8);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,(QByteArray *)&local_108);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,*(undefined4 *)(_stream + 0x18));
  bVar2 = checkFormat(this,(QDataStream *)&local_58);
  if (bVar2) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_78,(QByteArray *)&local_108);
    puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,*(undefined4 *)(_stream + 0x18));
    this_00 = &this->dockAreaLayout;
    while( true ) {
      cVar1 = QDataStream::atEnd();
      if (cVar1 != '\0') break;
      marker = 0xaa;
      QDataStream::operator>>((QDataStream *)&local_78,&marker);
      switch(marker) {
      case 0xf9:
        local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_128.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
        allMyDockWidgets((QList<QDockWidget_*> *)&local_128,&this->mainWindow->super_QWidget);
        this_01 = qt_mainwindow_layout(this->mainWindow);
        this_02 = QMainWindowLayout::createTabbedDockWindow((QMainWindowLayout *)this_01);
        QDockAreaLayoutInfo::QDockAreaLayoutInfo
                  ((QDockAreaLayoutInfo *)local_e8,&(this->dockAreaLayout).sep,LeftDock,Horizontal,1
                   ,this->mainWindow);
        pQVar4 = QWidget::layout(&this_02->super_QWidget);
        QDockAreaLayoutInfo::operator=
                  ((QDockAreaLayoutInfo *)&pQVar4[4].super_QLayoutItem,
                   (QDockAreaLayoutInfo *)local_e8);
        QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_e8);
        _local_e8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
        ::operator>>((QDataStream *)&local_78,(QRect *)local_e8);
        pQVar4 = QWidget::layout(&this_02->super_QWidget);
        this_05 = &pQVar4[4].super_QLayoutItem;
        pQVar5 = (QWidget *)0x0;
        bVar2 = QDockAreaLayoutInfo::restoreState
                          ((QDockAreaLayoutInfo *)this_05,(QDataStream *)&local_78,
                           (QList<QDockWidget_*> *)&local_128,false);
        if (!bVar2) {
          this_04 = &local_128;
LAB_004013bb:
          QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(this_04);
          goto switchD_00401009_caseD_fa;
        }
        rect._8_8_ = this_02;
        rect._0_8_ = uStack_e0;
        _local_e8 = QDockAreaLayout::constrainedRect((QDockAreaLayout *)local_e8,rect,pQVar5);
        local_148.d = local_e8;
        QWidget::move(&this_02->super_QWidget,(QPoint *)&local_148);
        local_148.d = (Data *)CONCAT44((uStack_e0._4_4_ - local_e8._4_4_) + 1,
                                       (uStack_e0._0_4_ - local_e8._0_4_) + 1);
        QWidget::resize(&this_02->super_QWidget,(QSize *)&local_148);
        bVar2 = QDockAreaLayoutInfo::onlyHasPlaceholders((QDockAreaLayoutInfo *)this_05);
        if (bVar2) {
          QDockAreaLayoutInfo::reparentWidgets
                    ((QDockAreaLayoutInfo *)this_05,&this_02->super_QWidget);
        }
        else {
          QWidget::show(&this_02->super_QWidget);
        }
        QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(&local_128);
        break;
      default:
        goto switchD_00401009_caseD_fa;
      case 0xfc:
      case 0xfe:
        local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        uStack_e0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        findChildrenHelper<QToolBar*>((QList<QToolBar_*> *)local_e8,(QObject *)this->mainWindow);
        bVar2 = QToolBarAreaLayout::restoreState
                          (&this->toolBarAreaLayout,(QDataStream *)&local_78,
                           (QList<QToolBar_*> *)local_e8,marker,false);
        if (!bVar2) {
          QArrayDataPointer<QToolBar_*>::~QArrayDataPointer
                    ((QArrayDataPointer<QToolBar_*> *)local_e8);
          goto switchD_00401009_caseD_fa;
        }
        for (ppQVar6 = (QWidget **)0x0; ppQVar6 < local_d8;
            ppQVar6 = (QWidget **)((long)ppQVar6 + 1)) {
          pQVar5 = *(QWidget **)(&(uStack_e0->super_QArrayData).ref_ + (long)ppQVar6 * 2);
          local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_128.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
          QToolBarAreaLayout::indexOf((QList<int> *)&local_128,&this->toolBarAreaLayout,pQVar5);
          if ((undefined1 *)local_128.size == (undefined1 *)0x0) {
            local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_148.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
            QToolBarAreaLayout::indexOf
                      ((QList<int> *)&local_148,&oldState->toolBarAreaLayout,pQVar5);
            if ((undefined1 *)local_148.size != (undefined1 *)0x0) {
              QToolBarAreaLayoutInfo::insertToolBar
                        ((this->toolBarAreaLayout).docks + *local_148.ptr,(QToolBar *)0x0,
                         (QToolBar *)pQVar5);
            }
            QArrayDataPointer<int>::~QArrayDataPointer(&local_148);
          }
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_128);
        }
        QArrayDataPointer<QToolBar_*>::~QArrayDataPointer((QArrayDataPointer<QToolBar_*> *)local_e8)
        ;
        break;
      case 0xfd:
        local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        uStack_e0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        allMyDockWidgets((QList<QDockWidget_*> *)local_e8,&this->mainWindow->super_QWidget);
        bVar2 = QDockAreaLayout::restoreState
                          (this_00,(QDataStream *)&local_78,(QList<QDockWidget_*> *)local_e8,false);
        if (!bVar2) {
          this_04 = (QArrayDataPointer<QDockWidget_*> *)local_e8;
          goto LAB_004013bb;
        }
        for (ppQVar6 = (QWidget **)0x0; ppQVar6 < local_d8;
            ppQVar6 = (QWidget **)((long)ppQVar6 + 1)) {
          pQVar5 = *(QWidget **)(&(uStack_e0->super_QArrayData).ref_ + (long)ppQVar6 * 2);
          local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_128.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
          QDockAreaLayout::indexOf((QList<int> *)&local_128,this_00,pQVar5);
          if ((undefined1 *)local_128.size == (undefined1 *)0x0) {
            local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_148.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
            QDockAreaLayout::indexOf((QList<int> *)&local_148,&oldState->dockAreaLayout,pQVar5);
            if (((undefined1 *)local_148.size != (undefined1 *)0x0) &&
               (this_03 = QDockAreaLayout::info(this_00,(QList<int> *)&local_148),
               this_03 != (QDockAreaLayoutInfo *)0x0)) {
              QDockAreaLayoutInfo::add(this_03,pQVar5);
            }
            QArrayDataPointer<int>::~QArrayDataPointer(&local_148);
          }
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_128);
        }
        QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer
                  ((QArrayDataPointer<QDockWidget_*> *)local_e8);
      }
    }
switchD_00401009_caseD_fa:
    QDataStream::~QDataStream((QDataStream *)&local_78);
  }
  else {
    cVar1 = '\0';
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::restoreState(QDataStream &_stream,
                                        const QMainWindowLayoutState &oldState)
{
    //make a copy of the data so that we can read it more than once
    QByteArray copy;
    while(!_stream.atEnd()) {
        int length = 1024;
        QByteArray ba(length, '\0');
        length = _stream.readRawData(ba.data(), ba.size());
        ba.resize(length);
        copy += ba;
    }

    QDataStream ds(copy);
    ds.setVersion(_stream.version());
    if (!checkFormat(ds))
        return false;

    QDataStream stream(copy);
    stream.setVersion(_stream.version());

    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets))
                        return false;

                    for (int i = 0; i < dockWidgets.size(); ++i) {
                        QDockWidget *w = dockWidgets.at(i);
                        QList<int> path = dockAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.dockAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            QDockAreaLayoutInfo *info = dockAreaLayout.info(oldPath);
                            if (info == nullptr) {
                                continue;
                            }
                            info->add(w);
                        }
                    }
                }
                break;
#if QT_CONFIG(tabwidget)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
            {
                auto dockWidgets = allMyDockWidgets(mainWindow);
                QDockWidgetGroupWindow* floatingTab = qt_mainwindow_layout(mainWindow)->createTabbedDockWindow();
                *floatingTab->layoutInfo() = QDockAreaLayoutInfo(
                    &dockAreaLayout.sep, QInternal::LeftDock, // FIXME: DockWidget doesn't save original docking area
                    Qt::Horizontal, QTabBar::RoundedSouth, mainWindow);
                QRect geometry;
                stream >> geometry;
                QDockAreaLayoutInfo *info = floatingTab->layoutInfo();
                if (!info->restoreState(stream, dockWidgets, false))
                    return false;
                geometry = QDockAreaLayout::constrainedRect(geometry, floatingTab);
                floatingTab->move(geometry.topLeft());
                floatingTab->resize(geometry.size());

                // Don't show an empty QDockWidgetGroupWindow if no dock widget is available yet.
                // reparentWidgets() would be triggered by show(), so do it explicitly here.
                if (info->onlyHasPlaceholders())
                    info->reparentWidgets(floatingTab);
                else
                    floatingTab->show();
            }
            break;
#endif // QT_CONFIG(tabwidget)
#endif // QT_CONFIG(dockwidget)

#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker))
                        return false;

                    for (int i = 0; i < toolBars.size(); ++i) {
                        QToolBar *w = toolBars.at(i);
                        QList<int> path = toolBarAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.toolBarAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            toolBarAreaLayout.docks[oldPath.at(0)].insertToolBar(nullptr, w);
                        }
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)
            default:
                return false;
        }// switch
    } //while


    return true;
}